

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

bool __thiscall
trieste::detail::Inside<7UL>::match(Inside<7UL> *this,NodeIt *it,Node *parent,Match *match)

{
  TokenDef *pTVar1;
  TokenDef *pTVar2;
  element_type *peVar3;
  uint uVar4;
  element_type *peVar5;
  long lVar6;
  
  peVar5 = (parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar1 = (peVar5->type_).def;
  lVar6 = -0x38;
  do {
    pTVar2 = *(TokenDef **)((long)(this[1].types._M_elems + -3) + lVar6);
    if (pTVar1 == pTVar2) {
      peVar3 = (this->super_PatternDef).continuation.
               super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        peVar5 = (element_type *)0x1;
      }
      else {
        uVar4 = (*peVar3->_vptr_PatternDef[4])();
        peVar5 = (element_type *)(ulong)uVar4;
      }
      break;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0);
  return (bool)(pTVar1 == pTVar2 & (byte)peVar5);
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        for (const auto& type : types)
        {
          if (parent->type() == type)
            return match_continuation(it, parent, match);
        }

        return false;
      }